

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTiledOutputFile.cpp
# Opt level: O0

void __thiscall Imf_2_5::TiledOutputFile::initialize(TiledOutputFile *this,Header *header)

{
  long lVar1;
  bool bVar2;
  Format FVar3;
  LineOrder *pLVar4;
  TileDescription *pTVar5;
  long lVar6;
  size_t sVar7;
  TileOffsets *pTVar8;
  value_type comp;
  TileBuffer *this_00;
  Array<char> *this_01;
  reference ppTVar9;
  int *in_RDI;
  TileOffsets *this_02;
  TileOffsets *numXTiles;
  size_t i;
  Box2i *dataWindow;
  string *in_stack_000000e8;
  Header *in_stack_000000f0;
  Header *in_stack_ffffffffffffff70;
  int **in_stack_ffffffffffffff80;
  int *in_stack_ffffffffffffff88;
  Header *in_stack_ffffffffffffffb0;
  Header *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  int in_stack_ffffffffffffffc4;
  int in_stack_ffffffffffffffc8;
  LevelMode in_stack_ffffffffffffffcc;
  TileOffsets *pTVar10;
  TileOffsets *this_03;
  TileCoord local_28;
  Box2i *local_18;
  
  Header::operator=((Header *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                    in_stack_ffffffffffffffb8);
  pLVar4 = Header::lineOrder((Header *)0x2ab8a3);
  *(LineOrder *)(*(long *)(in_RDI + 2) + 0x88) = *pLVar4;
  pTVar5 = Header::tileDescription((Header *)0x2ab8c0);
  lVar6 = *(long *)(in_RDI + 2);
  *(undefined8 *)(lVar6 + 0x40) = *(undefined8 *)pTVar5;
  *(undefined8 *)(lVar6 + 0x48) = *(undefined8 *)&pTVar5->mode;
  bVar2 = Header::hasType((Header *)0x2ab8e4);
  if (bVar2) {
    Header::setType(in_stack_000000f0,in_stack_000000e8);
  }
  local_18 = Header::dataWindow((Header *)0x2ab90d);
  *(int *)(*(long *)(in_RDI + 2) + 0x8c) = (local_18->min).x;
  *(int *)(*(long *)(in_RDI + 2) + 0x90) = (local_18->max).x;
  *(int *)(*(long *)(in_RDI + 2) + 0x94) = (local_18->min).y;
  *(int *)(*(long *)(in_RDI + 2) + 0x98) = (local_18->max).y;
  numXTiles = (TileOffsets *)(*(long *)(in_RDI + 2) + 0xb0);
  this_02 = (TileOffsets *)(*(long *)(in_RDI + 2) + 0x9c);
  lVar6 = *(long *)(in_RDI + 2) + 0xa0;
  precalculateTileInfo
            ((TileDescription *)in_stack_ffffffffffffff70,(int)((ulong)lVar6 >> 0x20),(int)lVar6,
             (int)((ulong)this_02 >> 0x20),(int)this_02,(int **)numXTiles,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffff88,in_RDI);
  if (*(int *)(*(long *)(in_RDI + 2) + 0x88) == 0) {
    anon_unknown_5::TileCoord::TileCoord(&local_28,0,0,0,0);
  }
  else {
    anon_unknown_5::TileCoord::TileCoord
              (&local_28,0,**(int **)(*(long *)(in_RDI + 2) + 0xb0) + -1,0,0);
  }
  lVar1 = *(long *)(in_RDI + 2);
  *(undefined8 *)(lVar1 + 0x160) = local_28._0_8_;
  *(undefined8 *)(lVar1 + 0x168) = local_28._8_8_;
  sVar7 = calculateBytesPerPixel(in_stack_ffffffffffffff70);
  *(size_t *)(*(long *)(in_RDI + 2) + 0x100) = sVar7 * *(uint *)(*(long *)(in_RDI + 2) + 0x40);
  *(ulong *)(*(long *)(in_RDI + 2) + 0x120) =
       *(long *)(*(long *)(in_RDI + 2) + 0x100) * (ulong)*(uint *)(*(long *)(in_RDI + 2) + 0x44);
  pTVar10 = (TileOffsets *)0x0;
  while (this_03 = pTVar10,
        pTVar8 = (TileOffsets *)
                 std::
                 vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                 ::size((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                         *)(*(long *)(in_RDI + 2) + 0x108)), pTVar10 < pTVar8) {
    comp = (value_type)operator_new(0x88);
    this_00 = (TileBuffer *)Header::compression((Header *)0x2abaff);
    this_01 = (Array<char> *)
              newTileCompressor(in_stack_ffffffffffffffcc,
                                CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0),
                                (size_t)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
    anon_unknown_5::TileBuffer::TileBuffer(this_00,(Compressor *)comp);
    ppTVar9 = std::
              vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
              ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                            *)(*(long *)(in_RDI + 2) + 0x108),(size_type)this_03);
    *ppTVar9 = comp;
    std::
    vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
    ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                  *)(*(long *)(in_RDI + 2) + 0x108),(size_type)this_03);
    Array<char>::resizeErase(this_01,lVar6);
    pTVar10 = (TileOffsets *)((long)&this_03->_mode + 1);
  }
  std::
  vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
  ::operator[]((vector<Imf_2_5::(anonymous_namespace)::TileBuffer_*,_std::allocator<Imf_2_5::(anonymous_namespace)::TileBuffer_*>_>
                *)(*(long *)(in_RDI + 2) + 0x108),0);
  FVar3 = defaultFormat((Compressor *)this_02);
  *(Format *)(*(long *)(in_RDI + 2) + 0xe0) = FVar3;
  TileOffsets::TileOffsets
            (this_03,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc4,
             (int *)in_stack_ffffffffffffffb8,(int *)in_stack_ffffffffffffffb0);
  TileOffsets::operator=(this_02,numXTiles);
  TileOffsets::~TileOffsets((TileOffsets *)0x2abc63);
  return;
}

Assistant:

void
TiledOutputFile::initialize (const Header &header)
{
    _data->header = header;
    _data->lineOrder = _data->header.lineOrder();

    
    
    //
    // Check that the file is indeed tiled
    //

    _data->tileDesc = _data->header.tileDescription();

    
    //
    // 'Fix' the type attribute if it exists but is incorrectly set
    // (attribute is optional, but ensure it is correct if it exists)
    //
    if(_data->header.hasType())
    {
        _data->header.setType(TILEDIMAGE);
    }

    
    //
    // Save the dataWindow information
    //

    const Box2i &dataWindow = _data->header.dataWindow();
    _data->minX = dataWindow.min.x;
    _data->maxX = dataWindow.max.x;
    _data->minY = dataWindow.min.y;
    _data->maxY = dataWindow.max.y;

    //
    // Precompute level and tile information to speed up utility functions
    //

    precalculateTileInfo (_data->tileDesc,
			  _data->minX, _data->maxX,
			  _data->minY, _data->maxY,
			  _data->numXTiles, _data->numYTiles,
			  _data->numXLevels, _data->numYLevels);       
    
    //
    // Determine the first tile coordinate that we will be writing
    // if the file is not RANDOM_Y.
    //
    
    _data->nextTileToWrite = (_data->lineOrder == INCREASING_Y)?
			       TileCoord (0, 0, 0, 0):
			       TileCoord (0, _data->numYTiles[0] - 1, 0, 0);

    _data->maxBytesPerTileLine =
	    calculateBytesPerPixel (_data->header) * _data->tileDesc.xSize;

    _data->tileBufferSize = _data->maxBytesPerTileLine * _data->tileDesc.ySize;
     
    //
    // Create all the TileBuffers and allocate their internal buffers
    //

    for (size_t i = 0; i < _data->tileBuffers.size(); i++)
    {
        _data->tileBuffers[i] = new TileBuffer (newTileCompressor
						  (_data->header.compression(),
						   _data->maxBytesPerTileLine,
						   _data->tileDesc.ySize,
						   _data->header));

        _data->tileBuffers[i]->buffer.resizeErase(_data->tileBufferSize);
    }

    _data->format = defaultFormat (_data->tileBuffers[0]->compressor);

    _data->tileOffsets = TileOffsets (_data->tileDesc.mode,
				      _data->numXLevels,
				      _data->numYLevels,
				      _data->numXTiles,
				      _data->numYTiles);
}